

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O1

void ncnn::convdw3x3s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  int iVar74;
  uint uVar75;
  uint uVar76;
  long lVar77;
  long lVar78;
  float *pfVar79;
  float *pfVar80;
  int iVar81;
  long lVar82;
  float *pfVar83;
  float *pfVar84;
  float *pfVar85;
  float *pfVar86;
  undefined1 (*pauVar87) [16];
  undefined8 uVar88;
  undefined8 uVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_6c;
  
  iVar6 = bottom_blob->c;
  if (0 < (long)iVar6) {
    uVar7 = top_blob->w;
    iVar8 = top_blob->h;
    pvVar9 = _bias->data;
    lVar82 = 0;
    do {
      if (pvVar9 == (void *)0x0) {
        uVar88 = 0;
        uVar93 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar9 + lVar82 * 0x10);
        uVar88 = *puVar1;
        uVar93 = puVar1[1];
      }
      local_118 = (float)uVar88;
      fStack_114 = (float)((ulong)uVar88 >> 0x20);
      fStack_110 = (float)uVar93;
      fStack_10c = (float)((ulong)uVar93 >> 0x20);
      if (0 < iVar8) {
        pauVar87 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar82 * top_blob->elemsize + (long)top_blob->data);
        lVar77 = kernel->w * lVar82 * kernel->elemsize;
        pvVar10 = kernel->data;
        pauVar2 = (undefined1 (*) [12])((long)pvVar10 + lVar77);
        auVar70 = *pauVar2;
        auVar68 = *pauVar2;
        local_f8 = (float)*(undefined8 *)*pauVar2;
        fStack_f4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_f0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_ec = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        pauVar2 = (undefined1 (*) [12])((long)pvVar10 + lVar77 + 0x10);
        auVar71 = *pauVar2;
        auVar66 = *pauVar2;
        local_e8 = (float)*(undefined8 *)*pauVar2;
        fStack_e4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_e0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_dc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        pauVar2 = (undefined1 (*) [12])((long)pvVar10 + lVar77 + 0x20);
        auVar72 = *pauVar2;
        auVar67 = *pauVar2;
        auVar65 = *pauVar2;
        local_d8 = (float)*(undefined8 *)*pauVar2;
        fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_d0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_cc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        auVar4 = *(undefined1 (*) [16])((long)pvVar10 + lVar77 + 0x30);
        auVar5 = *(undefined1 (*) [16])((long)pvVar10 + lVar77 + 0x40);
        pfVar85 = (float *)((long)pvVar10 + lVar77 + 0x50);
        fVar59 = *pfVar85;
        fVar60 = pfVar85[1];
        fVar61 = pfVar85[2];
        fVar62 = pfVar85[3];
        pauVar2 = (undefined1 (*) [12])((long)pvVar10 + lVar77 + 0x60);
        fVar47 = *(float *)*pauVar2;
        fVar48 = *(float *)(*pauVar2 + 4);
        fVar49 = *(float *)(*pauVar2 + 8);
        auVar73 = *pauVar2;
        fVar50 = *(float *)pauVar2[1];
        pfVar85 = (float *)((long)pvVar10 + lVar77 + 0x70);
        fVar51 = *pfVar85;
        fVar52 = pfVar85[1];
        fVar53 = pfVar85[2];
        fVar54 = pfVar85[3];
        pfVar85 = (float *)((long)pvVar10 + lVar77 + 0x80);
        fVar55 = *pfVar85;
        fVar56 = pfVar85[1];
        fVar57 = pfVar85[2];
        fVar58 = pfVar85[3];
        pfVar85 = (float *)(bottom_blob->cstep * lVar82 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        lVar77 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar79 = (float *)(lVar77 * 2 + (long)pfVar85);
        pfVar83 = (float *)(lVar77 + (long)pfVar85);
        iVar81 = 0;
        do {
          local_148 = auVar4._0_4_;
          fStack_144 = auVar4._4_4_;
          fStack_13c = auVar4._12_4_;
          local_128 = auVar5._0_4_;
          fStack_124 = auVar5._4_4_;
          fStack_120 = auVar5._8_4_;
          fStack_11c = auVar5._12_4_;
          fStack_140 = auVar4._8_4_;
          if ((int)uVar7 < 8) {
            uVar76 = 0;
          }
          else {
            iVar74 = 7;
            do {
              fVar11 = pfVar85[1];
              fVar12 = pfVar85[2];
              fVar13 = pfVar85[3];
              fVar14 = pfVar85[4];
              fVar15 = pfVar85[5];
              fVar16 = pfVar85[6];
              fVar17 = pfVar85[7];
              fVar18 = pfVar85[8];
              fVar19 = pfVar85[9];
              fVar20 = pfVar85[10];
              fVar21 = pfVar85[0xb];
              fVar22 = pfVar83[1];
              fVar23 = pfVar83[2];
              fVar24 = pfVar83[3];
              fVar25 = pfVar83[4];
              fVar26 = pfVar83[5];
              fVar27 = pfVar83[6];
              fVar28 = pfVar83[7];
              fVar29 = pfVar83[8];
              fVar30 = pfVar83[9];
              fVar31 = pfVar83[10];
              fVar32 = pfVar83[0xb];
              fVar33 = pfVar79[1];
              fVar34 = pfVar79[2];
              fVar35 = pfVar79[3];
              fVar36 = pfVar79[4];
              fVar37 = pfVar79[5];
              fVar38 = pfVar79[6];
              fVar39 = pfVar79[7];
              fVar40 = pfVar79[8];
              fVar41 = pfVar79[9];
              fVar42 = pfVar79[10];
              fVar43 = pfVar79[0xb];
              fVar44 = pfVar79[0xc];
              fVar45 = pfVar79[0xd];
              fVar46 = pfVar79[0xe];
              fVar100 = pfVar79[0xf];
              local_c8 = (float)*(undefined8 *)(pfVar85 + 0xc);
              fStack_c4 = (float)((ulong)*(undefined8 *)(pfVar85 + 0xc) >> 0x20);
              fStack_c0 = (float)*(undefined8 *)(pfVar85 + 0xe);
              fStack_bc = (float)((ulong)*(undefined8 *)(pfVar85 + 0xe) >> 0x20);
              local_98 = (float)*(undefined8 *)(pfVar83 + 0xc);
              fStack_94 = (float)((ulong)*(undefined8 *)(pfVar83 + 0xc) >> 0x20);
              fStack_90 = (float)*(undefined8 *)(pfVar83 + 0xe);
              fStack_8c = (float)((ulong)*(undefined8 *)(pfVar83 + 0xe) >> 0x20);
              *(float *)*pauVar87 =
                   local_f8 * *pfVar85 + local_118 + fVar18 * local_d8 + fVar14 * local_e8 +
                   local_148 * *pfVar83 + fVar25 * local_128 + fVar29 * fVar59 +
                   fVar47 * *pfVar79 + fVar36 * fVar51 + fVar40 * fVar55;
              *(float *)((long)*pauVar87 + 4) =
                   fStack_f4 * fVar11 + fStack_114 + fVar19 * fStack_d4 + fVar15 * fStack_e4 +
                   fStack_144 * fVar22 + fVar26 * fStack_124 + fVar30 * fVar60 +
                   fVar48 * fVar33 + fVar37 * fVar52 + fVar41 * fVar56;
              *(float *)((long)*pauVar87 + 8) =
                   fStack_f0 * fVar12 + fStack_110 + fVar20 * fStack_d0 + fVar16 * fStack_e0 +
                   fStack_140 * fVar23 + fVar27 * fStack_120 + fVar31 * fVar61 +
                   fVar49 * fVar34 + fVar38 * fVar53 + fVar42 * fVar57;
              *(float *)((long)*pauVar87 + 0xc) =
                   fStack_ec * fVar13 + fStack_10c + fVar21 * fStack_cc + fVar17 * fStack_dc +
                   fStack_13c * fVar24 + fVar28 * fStack_11c + fVar32 * fVar62 +
                   fVar50 * fVar35 + fVar39 * fVar54 + fVar43 * fVar58;
              fVar11 = pfVar85[0x10];
              fVar12 = pfVar85[0x11];
              fVar13 = pfVar85[0x12];
              fVar22 = pfVar85[0x13];
              fVar23 = pfVar83[0x10];
              fVar24 = pfVar83[0x11];
              fVar33 = pfVar83[0x12];
              fVar34 = pfVar83[0x13];
              fVar35 = pfVar79[0x10];
              fVar102 = pfVar79[0x11];
              fVar104 = pfVar79[0x12];
              fVar105 = pfVar79[0x13];
              *(float *)pauVar87[1] =
                   fVar14 * local_f8 + local_118 + fVar25 * local_148 + fVar18 * local_e8 +
                   fVar29 * local_128 + fVar47 * fVar36 + fVar40 * fVar51 +
                   local_c8 * local_d8 + local_98 * fVar59 + fVar44 * fVar55;
              *(float *)(pauVar87[1] + 4) =
                   fVar15 * fStack_f4 + fStack_114 + fVar26 * fStack_144 + fVar19 * fStack_e4 +
                   fVar30 * fStack_124 + fVar48 * fVar37 + fVar41 * fVar52 +
                   fStack_c4 * fStack_d4 + fStack_94 * fVar60 + fVar45 * fVar56;
              *(float *)(pauVar87[1] + 8) =
                   fVar16 * fStack_f0 + fStack_110 + fVar27 * fStack_140 + fVar20 * fStack_e0 +
                   fVar31 * fStack_120 + fVar49 * fVar38 + fVar42 * fVar53 +
                   fStack_c0 * fStack_d0 + fStack_90 * fVar61 + fVar46 * fVar57;
              *(float *)(pauVar87[1] + 0xc) =
                   fVar17 * fStack_ec + fStack_10c + fVar28 * fStack_13c + fVar21 * fStack_dc +
                   fVar32 * fStack_11c + fVar50 * fVar39 + fVar43 * fVar54 +
                   fStack_bc * fStack_cc + fStack_8c * fVar62 + fVar100 * fVar58;
              fVar14 = pfVar85[0x14];
              fVar15 = pfVar85[0x15];
              fVar16 = pfVar85[0x16];
              fVar17 = pfVar85[0x17];
              fVar25 = pfVar83[0x14];
              fVar26 = pfVar83[0x15];
              fVar27 = pfVar83[0x16];
              fVar28 = pfVar83[0x17];
              fVar36 = pfVar79[0x14];
              fVar37 = pfVar79[0x15];
              fVar38 = pfVar79[0x16];
              fVar39 = pfVar79[0x17];
              *(float *)pauVar87[2] =
                   fVar35 * fVar55 + fVar11 * local_d8 + fVar23 * fVar59 +
                   fVar18 * local_f8 + local_118 + fVar29 * local_148 + fVar40 * fVar47 +
                   local_c8 * local_e8 + local_98 * local_128 + fVar44 * fVar51;
              *(float *)(pauVar87[2] + 4) =
                   fVar102 * fVar56 + fVar12 * fStack_d4 + fVar24 * fVar60 +
                   fVar19 * fStack_f4 + fStack_114 + fVar30 * fStack_144 + fVar41 * fVar48 +
                   fStack_c4 * fStack_e4 + fStack_94 * fStack_124 + fVar45 * fVar52;
              *(float *)(pauVar87[2] + 8) =
                   fVar104 * fVar57 + fVar13 * fStack_d0 + fVar33 * fVar61 +
                   fVar20 * fStack_f0 + fStack_110 + fVar31 * fStack_140 + fVar42 * fVar49 +
                   fStack_c0 * fStack_e0 + fStack_90 * fStack_120 + fVar46 * fVar53;
              *(float *)(pauVar87[2] + 0xc) =
                   fVar105 * fVar58 + fVar22 * fStack_cc + fVar34 * fVar62 +
                   fVar21 * fStack_ec + fStack_10c + fVar32 * fStack_13c + fVar43 * fVar50 +
                   fStack_bc * fStack_dc + fStack_8c * fStack_11c + fVar100 * fVar54;
              fVar18 = pfVar85[0x18];
              fVar19 = pfVar85[0x19];
              fVar20 = pfVar85[0x1a];
              fVar21 = pfVar85[0x1b];
              fVar29 = pfVar83[0x18];
              fVar30 = pfVar83[0x19];
              fVar31 = pfVar83[0x1a];
              fVar32 = pfVar83[0x1b];
              fVar40 = pfVar79[0x18];
              fVar41 = pfVar79[0x19];
              fVar42 = pfVar79[0x1a];
              fVar43 = pfVar79[0x1b];
              *(float *)pauVar87[3] =
                   local_c8 * local_f8 + local_118 + local_98 * local_148 + fVar44 * fVar47 +
                   fVar11 * local_e8 + fVar23 * local_128 + fVar35 * fVar51 +
                   fVar55 * fVar36 + fVar14 * local_d8 + fVar25 * fVar59;
              *(float *)(pauVar87[3] + 4) =
                   fStack_c4 * fStack_f4 + fStack_114 + fStack_94 * fStack_144 + fVar45 * fVar48 +
                   fVar12 * fStack_e4 + fVar24 * fStack_124 + fVar102 * fVar52 +
                   fVar56 * fVar37 + fVar15 * fStack_d4 + fVar26 * fVar60;
              *(float *)(pauVar87[3] + 8) =
                   fStack_c0 * fStack_f0 + fStack_110 + fStack_90 * fStack_140 + fVar46 * fVar49 +
                   fVar13 * fStack_e0 + fVar33 * fStack_120 + fVar104 * fVar53 +
                   fVar57 * fVar38 + fVar16 * fStack_d0 + fVar27 * fVar61;
              *(float *)(pauVar87[3] + 0xc) =
                   fStack_bc * fStack_ec + fStack_10c + fStack_8c * fStack_13c + fVar100 * fVar50 +
                   fVar22 * fStack_dc + fVar34 * fStack_11c + fVar105 * fVar54 +
                   fVar58 * fVar39 + fVar17 * fStack_cc + fVar28 * fVar62;
              fVar44 = pfVar85[0x1c];
              fVar45 = pfVar85[0x1d];
              fVar46 = pfVar85[0x1e];
              fVar100 = pfVar85[0x1f];
              fVar106 = pfVar83[0x1c];
              fVar107 = pfVar83[0x1d];
              fVar108 = pfVar83[0x1e];
              fVar109 = pfVar83[0x1f];
              fVar99 = auVar65._0_4_;
              fVar101 = auVar65._4_4_;
              fVar103 = auVar65._8_4_;
              auVar90 = *(undefined1 (*) [16])(pfVar79 + 0x1c);
              fVar95 = auVar90._0_4_;
              fVar96 = auVar90._4_4_;
              fVar97 = auVar90._8_4_;
              fVar98 = auVar90._12_4_;
              *(float *)pauVar87[4] =
                   fVar11 * local_f8 + local_118 + fVar23 * local_148 + fVar35 * fVar47 +
                   fVar14 * local_e8 + fVar25 * local_128 + fVar36 * fVar51 +
                   fVar18 * local_d8 + fVar29 * fVar59 + fVar40 * fVar55;
              *(float *)(pauVar87[4] + 4) =
                   fVar12 * fStack_f4 + fStack_114 + fVar24 * fStack_144 + fVar102 * fVar48 +
                   fVar15 * fStack_e4 + fVar26 * fStack_124 + fVar37 * fVar52 +
                   fVar19 * fStack_d4 + fVar30 * fVar60 + fVar41 * fVar56;
              *(float *)(pauVar87[4] + 8) =
                   fVar13 * fStack_f0 + fStack_110 + fVar33 * fStack_140 + fVar104 * fVar49 +
                   fVar16 * fStack_e0 + fVar27 * fStack_120 + fVar38 * fVar53 +
                   fVar20 * fStack_d0 + fVar31 * fVar61 + fVar42 * fVar57;
              *(float *)(pauVar87[4] + 0xc) =
                   fVar22 * fStack_ec + fStack_10c + fVar34 * fStack_13c + fVar105 * fVar50 +
                   fVar17 * fStack_dc + fVar28 * fStack_11c + fVar39 * fVar54 +
                   fVar21 * fStack_cc + fVar32 * fVar62 + fVar43 * fVar58;
              auVar90 = *(undefined1 (*) [16])(pfVar85 + 0x20);
              fVar11 = pfVar83[0x20];
              fVar12 = pfVar83[0x21];
              fVar13 = pfVar83[0x22];
              fVar22 = pfVar83[0x23];
              fVar23 = pfVar79[0x20];
              fVar24 = pfVar79[0x21];
              fVar33 = pfVar79[0x22];
              fVar34 = pfVar79[0x23];
              *(float *)pauVar87[5] =
                   local_f8 * fVar14 + local_118 + fVar25 * local_148 + fVar36 * fVar47 +
                   fVar18 * local_e8 + fVar29 * local_128 + fVar40 * fVar51 +
                   fVar99 * fVar44 + fVar106 * fVar59 + fVar95 * fVar55;
              *(float *)(pauVar87[5] + 4) =
                   fStack_f4 * fVar15 + fStack_114 + fVar26 * fStack_144 + fVar37 * fVar48 +
                   fVar19 * fStack_e4 + fVar30 * fStack_124 + fVar41 * fVar52 +
                   fVar101 * fVar45 + fVar107 * fVar60 + fVar96 * fVar56;
              *(float *)(pauVar87[5] + 8) =
                   fStack_f0 * fVar16 + fStack_110 + fVar27 * fStack_140 + fVar38 * fVar49 +
                   fVar20 * fStack_e0 + fVar31 * fStack_120 + fVar42 * fVar53 +
                   fVar103 * fVar46 + fVar108 * fVar61 + fVar97 * fVar57;
              *(float *)(pauVar87[5] + 0xc) =
                   fStack_ec * fVar17 + fStack_10c + fVar28 * fStack_13c + fVar39 * fVar50 +
                   fVar21 * fStack_dc + fVar32 * fStack_11c + fVar43 * fVar54 +
                   fStack_cc * fVar100 + fVar109 * fVar62 + fVar98 * fVar58;
              fVar14 = pfVar85[0x24];
              fVar15 = pfVar85[0x25];
              fVar16 = pfVar85[0x26];
              fVar17 = pfVar85[0x27];
              fVar25 = pfVar83[0x24];
              fVar26 = pfVar83[0x25];
              fVar27 = pfVar83[0x26];
              fVar28 = pfVar83[0x27];
              fVar35 = pfVar79[0x24];
              fVar36 = pfVar79[0x25];
              fVar37 = pfVar79[0x26];
              fVar38 = pfVar79[0x27];
              *(float *)pauVar87[6] =
                   local_f8 * fVar18 + local_118 + fVar47 * fVar40 + fVar29 * local_148 +
                   fVar44 * local_e8 + fVar106 * local_128 + fVar95 * fVar51 +
                   auVar90._0_4_ * fVar99 + fVar11 * fVar59 + fVar23 * fVar55;
              *(float *)(pauVar87[6] + 4) =
                   fStack_f4 * fVar19 + fStack_114 + fVar48 * fVar41 + fVar30 * fStack_144 +
                   fVar45 * fStack_e4 + fVar107 * fStack_124 + fVar96 * fVar52 +
                   auVar90._4_4_ * fVar101 + fVar12 * fVar60 + fVar24 * fVar56;
              *(float *)(pauVar87[6] + 8) =
                   fStack_f0 * fVar20 + fStack_110 + fVar49 * fVar42 + fVar31 * fStack_140 +
                   fVar46 * fStack_e0 + fVar108 * fStack_120 + fVar97 * fVar53 +
                   auVar90._8_4_ * fVar103 + fVar13 * fVar61 + fVar33 * fVar57;
              *(float *)(pauVar87[6] + 0xc) =
                   fStack_ec * fVar21 + fStack_10c + fVar50 * fVar43 + fVar32 * fStack_13c +
                   fVar100 * fStack_dc + fVar109 * fStack_11c + fVar98 * fVar54 +
                   auVar90._12_4_ * fStack_cc + fVar22 * fVar62 + fVar34 * fVar58;
              auVar89._0_4_ =
                   local_f8 * fVar44 + local_118 + fVar106 * local_148 + fVar95 * fVar47 +
                   auVar90._0_4_ * local_e8 + fVar11 * local_128 + fVar23 * fVar51 +
                   fVar99 * fVar14 + fVar59 * fVar25 + fVar55 * fVar35;
              auVar89._4_4_ =
                   fStack_f4 * fVar45 + fStack_114 + fVar107 * fStack_144 + fVar96 * fVar48 +
                   auVar90._4_4_ * fStack_e4 + fVar12 * fStack_124 + fVar24 * fVar52 +
                   fVar101 * fVar15 + fVar60 * fVar26 + fVar56 * fVar36;
              auVar89._8_4_ =
                   fStack_f0 * fVar46 + fStack_110 + fVar108 * fStack_140 + fVar97 * fVar49 +
                   auVar90._8_4_ * fStack_e0 + fVar13 * fStack_120 + fVar33 * fVar53 +
                   fVar103 * fVar16 + fVar61 * fVar27 + fVar57 * fVar37;
              auVar89._12_4_ =
                   fStack_ec * fVar100 + fStack_10c + fVar109 * fStack_13c + fVar98 * fVar50 +
                   auVar90._12_4_ * fStack_dc + fVar22 * fStack_11c + fVar34 * fVar54 +
                   fStack_cc * fVar17 + fVar62 * fVar28 + fVar58 * fVar38;
              pauVar87[7] = auVar89;
              pfVar85 = pfVar85 + 0x20;
              pfVar83 = pfVar83 + 0x20;
              pfVar79 = pfVar79 + 0x20;
              pauVar87 = pauVar87 + 8;
              iVar74 = iVar74 + 8;
              uVar76 = uVar7 & 0xfffffff8;
            } while (iVar74 < (int)uVar7);
          }
          if ((int)(uVar76 | 3) < (int)uVar7) {
            lVar77 = 0;
            uVar75 = uVar76;
            do {
              lVar78 = lVar77;
              pfVar3 = (float *)((long)pfVar85 + lVar78);
              fVar14 = pfVar3[1];
              fVar15 = pfVar3[2];
              fVar16 = pfVar3[3];
              pfVar80 = (float *)((long)pfVar85 + lVar78 + 0x10);
              fVar17 = *pfVar80;
              fVar18 = pfVar80[1];
              fVar19 = pfVar80[2];
              fVar20 = pfVar80[3];
              auVar90 = *(undefined1 (*) [16])((long)pfVar85 + lVar78 + 0x20);
              puVar1 = (undefined8 *)((long)pfVar85 + lVar78 + 0x30);
              uVar88 = *puVar1;
              uVar93 = puVar1[1];
              fVar105 = auVar66._0_4_;
              fVar106 = auVar66._4_4_;
              fVar107 = auVar66._8_4_;
              fVar11 = auVar67._0_4_;
              fVar108 = auVar90._0_4_;
              fVar12 = auVar67._4_4_;
              fVar109 = auVar90._4_4_;
              fVar13 = auVar67._8_4_;
              fVar95 = auVar90._8_4_;
              fVar96 = auVar90._12_4_;
              pfVar80 = (float *)((long)pfVar83 + lVar78);
              fVar21 = pfVar80[1];
              fVar22 = pfVar80[2];
              fVar23 = pfVar80[3];
              pfVar84 = (float *)((long)pfVar83 + lVar78 + 0x10);
              fVar24 = *pfVar84;
              fVar25 = pfVar84[1];
              fVar26 = pfVar84[2];
              fVar27 = pfVar84[3];
              pfVar84 = (float *)((long)pfVar83 + lVar78 + 0x20);
              fVar28 = *pfVar84;
              fVar29 = pfVar84[1];
              fVar30 = pfVar84[2];
              fVar31 = pfVar84[3];
              pfVar84 = (float *)((long)pfVar83 + lVar78 + 0x30);
              fVar32 = *pfVar84;
              fVar33 = pfVar84[1];
              fVar34 = pfVar84[2];
              fVar35 = pfVar84[3];
              pfVar84 = (float *)((long)pfVar79 + lVar78);
              fVar36 = pfVar84[1];
              fVar37 = pfVar84[2];
              fVar38 = pfVar84[3];
              fVar100 = auVar73._0_4_;
              fVar102 = auVar73._4_4_;
              fVar104 = auVar73._8_4_;
              pfVar86 = (float *)((long)pfVar79 + lVar78 + 0x10);
              fVar39 = *pfVar86;
              fVar40 = pfVar86[1];
              fVar41 = pfVar86[2];
              fVar42 = pfVar86[3];
              pfVar86 = (float *)((long)pfVar79 + lVar78 + 0x20);
              fVar43 = *pfVar86;
              fVar44 = pfVar86[1];
              fVar45 = pfVar86[2];
              fVar46 = pfVar86[3];
              puVar1 = (undefined8 *)((long)pfVar79 + lVar78 + 0x30);
              uVar63 = *puVar1;
              uVar64 = puVar1[1];
              pfVar86 = (float *)((long)*pauVar87 + lVar78);
              *pfVar86 = local_f8 * *pfVar3 + local_118 + fVar105 * fVar17 + fVar108 * fVar11 +
                         local_148 * *pfVar80 + local_128 * fVar24 + fVar59 * fVar28 +
                         fVar43 * fVar55 + fVar39 * fVar51 + fVar100 * *pfVar84;
              pfVar86[1] = fStack_f4 * fVar14 + fStack_114 + fVar106 * fVar18 + fVar109 * fVar12 +
                           fStack_144 * fVar21 + fStack_124 * fVar25 + fVar60 * fVar29 +
                           fVar44 * fVar56 + fVar40 * fVar52 + fVar102 * fVar36;
              pfVar86[2] = fStack_f0 * fVar15 + fStack_110 + fVar107 * fVar19 + fVar95 * fVar13 +
                           fStack_140 * fVar22 + fStack_120 * fVar26 + fVar61 * fVar30 +
                           fVar45 * fVar57 + fVar41 * fVar53 + fVar104 * fVar37;
              pfVar86[3] = fStack_ec * fVar16 + fStack_10c + fStack_dc * fVar20 + fVar96 * fStack_cc
                           + fStack_13c * fVar23 + fStack_11c * fVar27 + fVar62 * fVar31 +
                           fVar46 * fVar58 + fVar42 * fVar54 + fVar50 * fVar38;
              local_c8 = (float)uVar88;
              fStack_c4 = (float)((ulong)uVar88 >> 0x20);
              fStack_c0 = (float)uVar93;
              fStack_bc = (float)((ulong)uVar93 >> 0x20);
              local_98 = (float)uVar63;
              fStack_94 = (float)((ulong)uVar63 >> 0x20);
              fStack_90 = (float)uVar64;
              fStack_8c = (float)((ulong)uVar64 >> 0x20);
              pfVar80 = (float *)((long)pfVar85 + lVar78 + 0x40);
              fVar14 = *pfVar80;
              fVar15 = pfVar80[1];
              fVar16 = pfVar80[2];
              fVar21 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar83 + lVar78 + 0x40);
              fVar22 = *pfVar80;
              fVar23 = pfVar80[1];
              fVar36 = pfVar80[2];
              fVar37 = pfVar80[3];
              pauVar2 = (undefined1 (*) [12])((long)pfVar79 + lVar78 + 0x40);
              auVar69 = *pauVar2;
              fStack_6c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
              pfVar80 = (float *)(pauVar87[1] + lVar78);
              *pfVar80 = fVar17 * local_f8 + local_118 + fVar108 * fVar105 + fVar24 * local_148 +
                         fVar28 * local_128 + fVar39 * fVar100 + fVar43 * fVar51 +
                         fVar11 * local_c8 + fVar32 * fVar59 + fVar55 * local_98;
              pfVar80[1] = fVar18 * fStack_f4 + fStack_114 + fVar109 * fVar106 + fVar25 * fStack_144
                           + fVar29 * fStack_124 + fVar40 * fVar102 + fVar44 * fVar52 +
                           fVar12 * fStack_c4 + fVar33 * fVar60 + fVar56 * fStack_94;
              pfVar80[2] = fVar19 * fStack_f0 + fStack_110 + fVar95 * fVar107 + fVar26 * fStack_140
                           + fVar30 * fStack_120 + fVar41 * fVar104 + fVar45 * fVar53 +
                           fVar13 * fStack_c0 + fVar34 * fVar61 + fVar57 * fStack_90;
              pfVar80[3] = fVar20 * fStack_ec + fStack_10c +
                           fVar96 * fStack_dc + fVar27 * fStack_13c +
                           fVar31 * fStack_11c + fVar42 * fVar50 + fVar46 * fVar54 +
                           fStack_cc * fStack_bc + fVar35 * fVar62 + fVar58 * fStack_8c;
              pfVar80 = (float *)((long)pfVar85 + lVar78 + 0x50);
              fVar17 = *pfVar80;
              fVar18 = pfVar80[1];
              fVar19 = pfVar80[2];
              fVar20 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar83 + lVar78 + 0x50);
              fVar24 = *pfVar80;
              fVar25 = pfVar80[1];
              fVar26 = pfVar80[2];
              fVar27 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar79 + lVar78 + 0x50);
              fVar38 = *pfVar80;
              fVar39 = pfVar80[1];
              fVar40 = pfVar80[2];
              fVar41 = pfVar80[3];
              pfVar80 = (float *)(pauVar87[2] + lVar78);
              *pfVar80 = fVar108 * auVar68._0_4_ + local_118 + fVar28 * local_148 + fVar43 * fVar100
                         + fVar105 * local_c8 + fVar32 * local_128 + local_98 * fVar51 +
                         fVar14 * fVar11 + fVar22 * fVar59 + auVar69._0_4_ * fVar55;
              pfVar80[1] = fVar109 * auVar68._4_4_ + fStack_114 +
                           fVar29 * fStack_144 + fVar44 * fVar102 +
                           fVar106 * fStack_c4 + fVar33 * fStack_124 + fStack_94 * fVar52 +
                           fVar15 * fVar12 + fVar23 * fVar60 + auVar69._4_4_ * fVar56;
              pfVar80[2] = fVar95 * auVar68._8_4_ + fStack_110 +
                           fVar30 * fStack_140 + fVar45 * fVar104 +
                           fVar107 * fStack_c0 + fVar34 * fStack_120 + fStack_90 * fVar53 +
                           fVar16 * fVar13 + fVar36 * fVar61 + auVar69._8_4_ * fVar57;
              pfVar80[3] = fVar96 * fStack_ec + fStack_10c + fVar31 * fStack_13c + fVar46 * fVar50 +
                           fStack_dc * fStack_bc + fVar35 * fStack_11c + fStack_8c * fVar54 +
                           fVar21 * fStack_cc + fVar37 * fVar62 + fStack_6c * fVar58;
              auVar90._0_4_ =
                   auVar68._0_4_ * local_c8 + local_118 + fVar32 * local_148 + fVar100 * local_98 +
                   fVar14 * fVar105 + fVar22 * local_128 + auVar69._0_4_ * fVar51 +
                   fVar11 * fVar17 + fVar59 * fVar24 + fVar55 * fVar38;
              auVar90._4_4_ =
                   auVar68._4_4_ * fStack_c4 + fStack_114 +
                   fVar33 * fStack_144 + fVar102 * fStack_94 +
                   fVar15 * fVar106 + fVar23 * fStack_124 + auVar69._4_4_ * fVar52 +
                   fVar12 * fVar18 + fVar60 * fVar25 + fVar56 * fVar39;
              auVar90._8_4_ =
                   auVar68._8_4_ * fStack_c0 + fStack_110 +
                   fVar34 * fStack_140 + fVar104 * fStack_90 +
                   fVar16 * fVar107 + fVar36 * fStack_120 + auVar69._8_4_ * fVar53 +
                   fVar13 * fVar19 + fVar61 * fVar26 + fVar57 * fVar40;
              auVar90._12_4_ =
                   fStack_ec * fStack_bc + fStack_10c + fVar35 * fStack_13c + fVar50 * fStack_8c +
                   fVar21 * fStack_dc + fVar37 * fStack_11c + fStack_6c * fVar54 +
                   fStack_cc * fVar20 + fVar62 * fVar27 + fVar58 * fVar41;
              *(undefined1 (*) [16])(pauVar87[3] + lVar78) = auVar90;
              uVar76 = uVar75 + 4;
              iVar74 = uVar75 + 7;
              lVar77 = lVar78 + 0x40;
              uVar75 = uVar76;
            } while (iVar74 < (int)uVar7);
            pfVar79 = (float *)((long)pfVar79 + lVar77);
            pfVar83 = (float *)((long)pfVar83 + lVar77);
            pfVar85 = (float *)((long)pfVar85 + lVar77);
            pauVar87 = (undefined1 (*) [16])(pauVar87[4] + lVar78);
          }
          if ((int)(uVar76 | 1) < (int)uVar7) {
            lVar77 = 0;
            uVar75 = uVar76;
            do {
              lVar78 = lVar77;
              pfVar80 = (float *)((long)pfVar85 + lVar78 + 0x10);
              fVar11 = *pfVar80;
              fVar12 = pfVar80[1];
              fVar13 = pfVar80[2];
              fVar14 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar85 + lVar78 + 0x20);
              fVar15 = *pfVar80;
              fVar16 = pfVar80[1];
              fVar17 = pfVar80[2];
              fVar18 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar83 + lVar78 + 0x10);
              fVar19 = *pfVar80;
              fVar20 = pfVar80[1];
              fVar21 = pfVar80[2];
              fVar22 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar83 + lVar78 + 0x20);
              fVar23 = *pfVar80;
              fVar24 = pfVar80[1];
              fVar25 = pfVar80[2];
              fVar26 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar79 + lVar78 + 0x10);
              fVar27 = *pfVar80;
              fVar28 = pfVar80[1];
              fVar29 = pfVar80[2];
              fVar30 = pfVar80[3];
              pfVar86 = (float *)((long)pfVar85 + lVar78);
              pfVar80 = (float *)((long)pfVar79 + lVar78 + 0x20);
              fVar31 = *pfVar80;
              fVar32 = pfVar80[1];
              fVar33 = pfVar80[2];
              fVar34 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar83 + lVar78);
              pfVar84 = (float *)((long)pfVar79 + lVar78);
              auVar94._0_4_ =
                   fVar47 * *pfVar84 + fVar27 * fVar51 + fVar31 * fVar55 +
                   local_148 * *pfVar80 + fVar19 * local_128 + fVar23 * fVar59 +
                   fVar11 * auVar71._0_4_ + auVar72._0_4_ * fVar15 +
                   local_118 + auVar70._0_4_ * *pfVar86;
              auVar94._4_4_ =
                   fVar48 * pfVar84[1] + fVar28 * fVar52 + fVar32 * fVar56 +
                   fStack_144 * pfVar80[1] + fVar20 * fStack_124 + fVar24 * fVar60 +
                   fVar12 * auVar71._4_4_ + auVar72._4_4_ * fVar16 +
                   fStack_114 + auVar70._4_4_ * pfVar86[1];
              auVar94._8_4_ =
                   fVar49 * pfVar84[2] + fVar29 * fVar53 + fVar33 * fVar57 +
                   fStack_140 * pfVar80[2] + fVar21 * fStack_120 + fVar25 * fVar61 +
                   fVar13 * auVar71._8_4_ + auVar72._8_4_ * fVar17 +
                   fStack_110 + auVar70._8_4_ * pfVar86[2];
              auVar94._12_4_ =
                   fVar50 * pfVar84[3] + fVar30 * fVar54 + fVar34 * fVar58 +
                   fStack_13c * pfVar80[3] + fVar22 * fStack_11c + fVar26 * fVar62 +
                   fVar14 * fStack_dc + fStack_cc * fVar18 + fStack_10c + fStack_ec * pfVar86[3];
              pfVar80 = (float *)((long)pfVar85 + lVar78 + 0x30);
              fVar35 = *pfVar80;
              fVar36 = pfVar80[1];
              fVar37 = pfVar80[2];
              fVar38 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar83 + lVar78 + 0x30);
              fVar39 = *pfVar80;
              fVar40 = pfVar80[1];
              fVar41 = pfVar80[2];
              fVar42 = pfVar80[3];
              pfVar80 = (float *)((long)pfVar79 + lVar78 + 0x30);
              fVar43 = *pfVar80;
              fVar44 = pfVar80[1];
              fVar45 = pfVar80[2];
              fVar46 = pfVar80[3];
              *(undefined1 (*) [16])((long)*pauVar87 + lVar78) = auVar94;
              auVar91._0_4_ =
                   auVar72._0_4_ * fVar35 + fVar59 * fVar39 + fVar55 * fVar43 +
                   local_118 + fVar11 * auVar70._0_4_ + auVar71._0_4_ * fVar15 + local_148 * fVar19
                   + local_128 * fVar23 + fVar27 * fVar47 + fVar31 * fVar51;
              auVar91._4_4_ =
                   auVar72._4_4_ * fVar36 + fVar60 * fVar40 + fVar56 * fVar44 +
                   fStack_114 + fVar12 * auVar70._4_4_ +
                   auVar71._4_4_ * fVar16 + fStack_144 * fVar20 +
                   fStack_124 * fVar24 + fVar28 * fVar48 + fVar32 * fVar52;
              auVar91._8_4_ =
                   auVar72._8_4_ * fVar37 + fVar61 * fVar41 + fVar57 * fVar45 +
                   fStack_110 + fVar13 * auVar70._8_4_ +
                   auVar71._8_4_ * fVar17 + fStack_140 * fVar21 +
                   fStack_120 * fVar25 + fVar29 * fVar49 + fVar33 * fVar53;
              auVar91._12_4_ =
                   fStack_cc * fVar38 + fVar62 * fVar42 + fVar58 * fVar46 +
                   fStack_10c + fVar14 * fStack_ec + fStack_dc * fVar18 + fStack_13c * fVar22 +
                   fStack_11c * fVar26 + fVar30 * fVar50 + fVar34 * fVar54;
              *(undefined1 (*) [16])(pauVar87[1] + lVar78) = auVar91;
              uVar76 = uVar75 + 2;
              iVar74 = uVar75 + 3;
              lVar77 = lVar78 + 0x20;
              uVar75 = uVar76;
            } while (iVar74 < (int)uVar7);
            pfVar79 = (float *)((long)pfVar79 + lVar77);
            pfVar83 = (float *)((long)pfVar83 + lVar77);
            pfVar85 = (float *)((long)pfVar85 + lVar77);
            pauVar87 = (undefined1 (*) [16])(pauVar87[2] + lVar78);
          }
          iVar74 = uVar7 - uVar76;
          pfVar80 = pfVar79;
          pfVar84 = pfVar83;
          pfVar86 = pfVar85;
          if (iVar74 != 0 && (int)uVar76 <= (int)uVar7) {
            do {
              pfVar85 = pfVar86 + 4;
              pfVar83 = pfVar84 + 4;
              pfVar79 = pfVar80 + 4;
              auVar92._0_4_ =
                   local_f8 * *pfVar86 + local_118 + local_e8 * pfVar86[4] + local_d8 * pfVar86[8] +
                   local_148 * *pfVar84 + local_128 * pfVar84[4] + fVar59 * pfVar84[8] +
                   fVar47 * *pfVar80 + fVar51 * pfVar80[4] + fVar55 * pfVar80[8];
              auVar92._4_4_ =
                   fStack_f4 * pfVar86[1] + fStack_114 +
                   fStack_e4 * pfVar86[5] + fStack_d4 * pfVar86[9] +
                   fStack_144 * pfVar84[1] + fStack_124 * pfVar84[5] + fVar60 * pfVar84[9] +
                   fVar48 * pfVar80[1] + fVar52 * pfVar80[5] + fVar56 * pfVar80[9];
              auVar92._8_4_ =
                   fStack_f0 * pfVar86[2] + fStack_110 +
                   fStack_e0 * pfVar86[6] + fStack_d0 * pfVar86[10] +
                   fStack_140 * pfVar84[2] + fStack_120 * pfVar84[6] + fVar61 * pfVar84[10] +
                   fVar49 * pfVar80[2] + fVar53 * pfVar80[6] + fVar57 * pfVar80[10];
              auVar92._12_4_ =
                   fStack_ec * pfVar86[3] + fStack_10c +
                   fStack_dc * pfVar86[7] + fStack_cc * pfVar86[0xb] +
                   fStack_13c * pfVar84[3] + fStack_11c * pfVar84[7] + fVar62 * pfVar84[0xb] +
                   fVar50 * pfVar80[3] + fVar54 * pfVar80[7] + fVar58 * pfVar80[0xb];
              *pauVar87 = auVar92;
              pauVar87 = pauVar87 + 1;
              iVar74 = iVar74 + -1;
              pfVar80 = pfVar79;
              pfVar84 = pfVar83;
              pfVar86 = pfVar85;
            } while (iVar74 != 0);
          }
          pfVar85 = pfVar85 + 8;
          pfVar83 = pfVar83 + 8;
          pfVar79 = pfVar79 + 8;
          iVar81 = iVar81 + 1;
        } while (iVar81 != iVar8);
      }
      lVar82 = lVar82 + 1;
    } while (lVar82 != iVar6);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_load_ps(k0);
        __m128 _k01 = _mm_load_ps(k0 + 4);
        __m128 _k02 = _mm_load_ps(k0 + 8);
        __m128 _k10 = _mm_load_ps(k0 + 12);
        __m128 _k11 = _mm_load_ps(k0 + 16);
        __m128 _k12 = _mm_load_ps(k0 + 20);
        __m128 _k20 = _mm_load_ps(k0 + 24);
        __m128 _k21 = _mm_load_ps(k0 + 28);
        __m128 _k22 = _mm_load_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                __m128 _sum4 = _bias0;
                __m128 _r06 = _mm_load_ps(r0 + 24);
                __m128 _r16 = _mm_load_ps(r1 + 24);
                __m128 _r26 = _mm_load_ps(r2 + 24);
                _mm_store_ps(outptr0 + 12, _sum3);

                _sum4 = _mm_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k22, _r26, _sum4);

                __m128 _sum5 = _bias0;
                __m128 _r07 = _mm_load_ps(r0 + 28);
                __m128 _r17 = _mm_load_ps(r1 + 28);
                __m128 _r27 = _mm_load_ps(r2 + 28);
                _mm_store_ps(outptr0 + 16, _sum4);

                _sum5 = _mm_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k22, _r27, _sum5);

                __m128 _sum6 = _bias0;
                __m128 _r08 = _mm_load_ps(r0 + 32);
                __m128 _r18 = _mm_load_ps(r1 + 32);
                __m128 _r28 = _mm_load_ps(r2 + 32);
                _mm_store_ps(outptr0 + 20, _sum5);

                _sum6 = _mm_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k22, _r28, _sum6);

                __m128 _sum7 = _bias0;
                __m128 _r09 = _mm_load_ps(r0 + 36);
                __m128 _r19 = _mm_load_ps(r1 + 36);
                __m128 _r29 = _mm_load_ps(r2 + 36);
                _mm_store_ps(outptr0 + 24, _sum6);

                _sum7 = _mm_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm_store_ps(outptr0 + 28, _sum7);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm_store_ps(outptr0 + 12, _sum3);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm_store_ps(outptr0 + 4, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm_store_ps(outptr0, _sum0);

                r0 += 4;
                r1 += 4;
                r2 += 4;
                outptr0 += 4;
            }

            r0 += 2 * 4;
            r1 += 2 * 4;
            r2 += 2 * 4;
        }
    }
}